

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O0

REF_STATUS ref_search_distance(REF_SEARCH ref_search,REF_INT a,REF_INT b,REF_DBL *distance)

{
  double dVar1;
  int local_24;
  REF_INT i;
  REF_DBL *distance_local;
  REF_INT b_local;
  REF_INT a_local;
  REF_SEARCH ref_search_local;
  
  *distance = 0.0;
  for (local_24 = 0; local_24 < ref_search->d; local_24 = local_24 + 1) {
    dVar1 = pow(ref_search->pos[local_24 + ref_search->d * b] -
                ref_search->pos[local_24 + ref_search->d * a],2.0);
    *distance = dVar1 + *distance;
  }
  dVar1 = sqrt(*distance);
  *distance = dVar1;
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_search_distance(REF_SEARCH ref_search, REF_INT a,
                                              REF_INT b, REF_DBL *distance) {
  REF_INT i;
  *distance = 0.0;
  for (i = 0; i < ref_search->d; i++)
    (*distance) += pow(ref_search->pos[i + ref_search->d * b] -
                           ref_search->pos[i + ref_search->d * a],
                       2);
  (*distance) = sqrt(*distance);
  return REF_SUCCESS;
}